

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O2

int __thiscall
TPZSkylNSymMatrix<double>::Subst_LForward(TPZSkylNSymMatrix<double> *this,TPZFMatrix<double> *B)

{
  char cVar1;
  double **ppdVar2;
  double *pdVar3;
  int iVar4;
  undefined4 extraout_var;
  int extraout_var_00;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  int iVar8;
  long row;
  int64_t j;
  long col;
  double dVar9;
  
  lVar5 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  iVar8 = 0;
  if ((lVar5 == CONCAT44(extraout_var,iVar4)) &&
     ((cVar1 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed, cVar1 == '\x04' ||
      (cVar1 == '\x01')))) {
    iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0xc])(this);
    row = 0;
    lVar5 = CONCAT44(extraout_var_00,iVar4);
    if (CONCAT44(extraout_var_00,iVar4) == 0 || extraout_var_00 < 0) {
      lVar5 = row;
    }
    for (; row != lVar5; row = row + 1) {
      for (col = 0; col < (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol; col = col + 1) {
        ppdVar2 = (this->fElemb).fStore;
        pdVar7 = ppdVar2[row];
        pdVar3 = ppdVar2[row + 1];
        pdVar6 = TPZFMatrix<double>::operator()(B,row,col);
        dVar9 = 0.0;
        while( true ) {
          pdVar7 = pdVar7 + 1;
          pdVar6 = pdVar6 + -1;
          if (pdVar3 <= pdVar7) break;
          dVar9 = dVar9 + *pdVar7 * *pdVar6;
        }
        pdVar7 = TPZFMatrix<double>::operator()(B,row,col);
        *pdVar7 = *pdVar7 - dVar9;
      }
    }
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int TPZSkylNSymMatrix<TVar>::Subst_LForward(TPZFMatrix<TVar> *B)const
{
  if ((B->Rows() != this->Dim()) || (this->fDecomposed != ELDLt && this->fDecomposed != ELU))
    return(0);

  int64_t dimension = this->Dim();
  for (int64_t k = 0; k < dimension; k++)
  {
    for (int64_t j = 0; j < B->Cols(); j++)
    {
      // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
      //
      TVar sum = 0.0;
      TVar *elem_ki = fElemb[k] + 1;
      TVar *end_ki = fElemb[k + 1];
      TVar *BPtr = &(*B)(k, j);
      while (elem_ki < end_ki)
        sum += (*elem_ki++) * (*--BPtr);

      // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
      //
      // B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
      BPtr = &(*B)(k, j);
      *BPtr -= sum;
    }
  }
  return(1);
}